

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

int __thiscall CVmRun::xor_and_push(CVmRun *this,vm_val_t *val1,vm_val_t *val2)

{
  uint uVar1;
  vm_datatype_t vVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  vm_datatype_t vVar6;
  
  vVar6 = val1->typ;
  uVar1 = vVar6 - VM_STACK;
  if (uVar1 < 0xfffffffe) {
LAB_001df929:
    if (val2->typ - VM_STACK < 0xfffffffe) {
      if (val2->typ != VM_INT || vVar6 != VM_INT) {
        return 0;
      }
      (val1->val).obj = (val1->val).obj ^ (val2->val).obj;
      goto LAB_001df9af;
    }
    pvVar5 = val1;
    if (0xfffffffd < uVar1) goto LAB_001df96a;
LAB_001df977:
    if (vVar6 != VM_INT) {
      err_throw(0x7d6);
    }
    pvVar5->typ = VM_TRUE - ((pvVar5->val).obj == 0);
LAB_001df98a:
    vVar6 = val1->typ;
    vVar2 = val2->typ;
  }
  else {
    vVar2 = val2->typ;
    if (vVar2 - VM_STACK < 0xfffffffe) {
      if (uVar1 < 0xfffffffe) goto LAB_001df929;
LAB_001df96a:
      vVar6 = val2->typ;
      pvVar5 = val2;
      if (vVar6 - VM_STACK < 0xfffffffe) goto LAB_001df977;
      goto LAB_001df98a;
    }
  }
  val1->typ = VM_TRUE - ((vVar2 != VM_TRUE) != (vVar6 == VM_TRUE));
LAB_001df9af:
  pvVar5 = sp_;
  uVar4 = *(undefined4 *)&val1->field_0x4;
  aVar3 = val1->val;
  sp_ = sp_ + 1;
  pvVar5->typ = val1->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar4;
  pvVar5->val = aVar3;
  return 1;
}

Assistant:

int CVmRun::xor_and_push(VMG_ vm_val_t *val1, vm_val_t *val2)
{
    /* figure what to do based on the types */
    if (val1->is_logical() && val2->is_logical())
    {
        /* both values are logical - compute the logical XOR */
        val1->set_logical(val1->get_logical() ^ val2->get_logical());
    }
    else if (val1->is_logical() || val2->is_logical())
    {
        /* 
         *   one value is logical, but not both - convert the other value
         *   from a number to a logical and compute the result as a
         *   logical value 
         */
        if (!val1->is_logical())
            val1->num_to_logical();
        else if (!val2->is_logical())
            val2->num_to_logical();

        /* compute the logical xor */
        val1->set_logical(val1->get_logical() ^ val2->get_logical());
    }
    else if (val1->typ == VM_INT && val2->typ == VM_INT)
    {
        /* compute and store the bitwise XOR */
        val1->val.intval = val1->val.intval ^ val2->val.intval;
    }
    else
    {
        /* there's no logical conversion, so we can't compute it here */
        return FALSE;
    }

    /* push the result */
    pushval(vmg_ val1);

    /* handled */
    return TRUE;
}